

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMeshFileLoader.cpp
# Opt level: O3

bool __thiscall
irr::scene::CXMeshFileLoader::parseDataObjectMeshNormals(CXMeshFileLoader *this,SXMesh *mesh)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  pointer pSVar6;
  pointer puVar7;
  pointer pSVar8;
  _Alloc_hider _Var9;
  bool bVar10;
  bool bVar11;
  u32 uVar12;
  u32 uVar13;
  u32 uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  array<irr::core::vector3d<float>_> normals;
  array<unsigned_int> polygonfaces;
  array<unsigned_int> normalIndices;
  string<char> local_b8;
  string<char> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  undefined1 local_60;
  string<char> local_58;
  
  bVar10 = readHeadOfDataObject(this,(stringc *)0x0);
  if (bVar10) {
    uVar12 = readInt(this);
    local_b8.str._M_dataplus._M_p = (pointer)0x0;
    local_b8.str._M_string_length = 0;
    local_b8.str.field_2._M_allocated_capacity = 0;
    local_b8.str.field_2._M_local_buf[8] = '\x01';
    ::std::vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>::resize
              ((vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_> *)
               &local_b8,(ulong)uVar12);
    if (uVar12 != 0) {
      lVar17 = 0;
      do {
        readVector3(this,(vector3df *)(local_b8.str._M_dataplus._M_p + lVar17));
        lVar17 = lVar17 + 0xc;
      } while ((ulong)uVar12 * 0xc != lVar17);
    }
    bVar10 = checkForTwoFollowingSemicolons(this);
    if (!bVar10) {
      os::Printer::log((Printer *)"No finishing semicolon in Mesh Normals Array found in x file",
                       (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      core::string<char>::string(&local_58,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.str._M_dataplus._M_p != &local_58.str.field_2) {
        operator_delete(local_58.str._M_dataplus._M_p,local_58.str.field_2._M_allocated_capacity + 1
                       );
      }
    }
    local_58.str._M_dataplus._M_p = (pointer)0x0;
    local_58.str._M_string_length = 0;
    uVar19 = 0;
    local_58.str.field_2._M_allocated_capacity = 0;
    local_58.str.field_2._M_local_buf[8] = '\x01';
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58,
               (ulong)((long)(mesh->Indices).m_data.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)(mesh->Indices).m_data.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
    uVar12 = readInt(this);
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (uint *)0x0;
    local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60 = 1;
    if (uVar12 != 0) {
      uVar16 = 0;
      do {
        uVar13 = readInt(this);
        _Var9._M_p = local_b8.str._M_dataplus._M_p;
        uVar2 = uVar13 - 2;
        if (uVar2 * 3 !=
            (uint)(mesh->IndexCountPerFace).m_data.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar16]) {
          os::Printer::log((Printer *)"Not matching normal and face index count found in x file",
                           (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
          goto LAB_001b9e94;
        }
        if (uVar2 == 1) {
          iVar18 = 0;
          do {
            uVar13 = readInt(this);
            pSVar6 = (mesh->Vertices).m_data.
                     super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar2 = (mesh->Indices).m_data.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[(uint)((int)uVar19 + iVar18)];
            uVar1 = *(undefined8 *)(_Var9._M_p + (ulong)uVar13 * 0xc);
            pSVar8 = pSVar6 + uVar2;
            (pSVar8->Normal).X = (float)(int)uVar1;
            (pSVar8->Normal).Y = (float)(int)((ulong)uVar1 >> 0x20);
            pSVar6[uVar2].Normal.Z = *(float *)(_Var9._M_p + (ulong)uVar13 * 0xc + 8);
            iVar18 = iVar18 + 1;
          } while (iVar18 != 3);
          uVar19 = (ulong)((int)uVar19 + 3);
        }
        else {
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    (&local_78,(ulong)uVar13);
          puVar7 = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (uVar13 != 0) {
            uVar15 = 0;
            do {
              uVar14 = readInt(this);
              puVar7[uVar15] = uVar14;
              uVar15 = uVar15 + 1;
            } while (uVar13 != uVar15);
            if (uVar2 == 0) goto LAB_001b9d8f;
          }
          pSVar6 = (mesh->Vertices).m_data.
                   super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar7 = (mesh->Indices).m_data.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar3 = *local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar15 = 2;
          do {
            iVar18 = (int)uVar19;
            uVar4 = puVar7[uVar19];
            uVar1 = *(undefined8 *)(local_b8.str._M_dataplus._M_p + (ulong)uVar3 * 0xc);
            pSVar6[uVar4].Normal.X = (float)(int)uVar1;
            pSVar6[uVar4].Normal.Y = (float)(int)((ulong)uVar1 >> 0x20);
            pSVar6[uVar4].Normal.Z =
                 *(float *)(local_b8.str._M_dataplus._M_p + (ulong)uVar3 * 0xc + 8);
            uVar4 = puVar7[iVar18 + 1];
            uVar5 = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar15 - 1];
            uVar1 = *(undefined8 *)(local_b8.str._M_dataplus._M_p + (ulong)uVar5 * 0xc);
            pSVar6[uVar4].Normal.X = (float)(int)uVar1;
            pSVar6[uVar4].Normal.Y = (float)(int)((ulong)uVar1 >> 0x20);
            pSVar6[uVar4].Normal.Z =
                 *(float *)(local_b8.str._M_dataplus._M_p + (ulong)uVar5 * 0xc + 8);
            uVar19 = (ulong)(iVar18 + 3);
            uVar4 = puVar7[iVar18 + 2];
            uVar5 = local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar15 & 0xffffffff];
            uVar1 = *(undefined8 *)(local_b8.str._M_dataplus._M_p + (ulong)uVar5 * 0xc);
            pSVar6[uVar4].Normal.X = (float)(int)uVar1;
            pSVar6[uVar4].Normal.Y = (float)(int)((ulong)uVar1 >> 0x20);
            pSVar6[uVar4].Normal.Z =
                 *(float *)(local_b8.str._M_dataplus._M_p + (ulong)uVar5 * 0xc + 8);
            lVar17 = uVar15 - uVar2;
            uVar15 = uVar15 + 1;
          } while (lVar17 != 1);
        }
LAB_001b9d8f:
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar12);
    }
    bVar10 = checkForTwoFollowingSemicolons(this);
    if (!bVar10) {
      os::Printer::log((Printer *)
                       "No finishing semicolon in Mesh Face Normals Array found in x file",
                       (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
      core::string<char>::string(&local_98,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.str._M_dataplus._M_p != &local_98.str.field_2) {
        operator_delete(local_98.str._M_dataplus._M_p,local_98.str.field_2._M_allocated_capacity + 1
                       );
      }
    }
    bVar11 = checkForClosingBrace(this);
    bVar10 = true;
    if (!bVar11) {
      os::Printer::log((Printer *)"No closing brace in Mesh Normals found in x file",
                       (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
LAB_001b9e94:
      core::string<char>::string(&local_98,this->Line);
      os::Printer::log((double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.str._M_dataplus._M_p != &local_98.str.field_2) {
        operator_delete(local_98.str._M_dataplus._M_p,local_98.str.field_2._M_allocated_capacity + 1
                       );
      }
      this->ErrorState = true;
      bVar10 = false;
    }
    if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_58.str._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_58.str._M_dataplus._M_p,
                      local_58.str.field_2._M_allocated_capacity -
                      (long)local_58.str._M_dataplus._M_p);
    }
    if (local_b8.str._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_b8.str._M_dataplus._M_p,
                      local_b8.str.field_2._M_allocated_capacity -
                      (long)local_b8.str._M_dataplus._M_p);
    }
  }
  else {
    os::Printer::log((Printer *)"No opening brace in Mesh Normals found in x file",
                     (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    core::string<char>::string(&local_b8,this->Line);
    os::Printer::log((double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.str._M_dataplus._M_p != &local_b8.str.field_2) {
      operator_delete(local_b8.str._M_dataplus._M_p,local_b8.str.field_2._M_allocated_capacity + 1);
    }
    this->ErrorState = true;
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool CXMeshFileLoader::parseDataObjectMeshNormals(SXMesh &mesh)
{
#ifdef _XREADER_DEBUG
	os::Printer::log("CXFileReader: reading mesh normals", ELL_DEBUG);
#endif

	if (!readHeadOfDataObject()) {
		os::Printer::log("No opening brace in Mesh Normals found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	// read count
	const u32 nNormals = readInt();
	core::array<core::vector3df> normals;
	normals.set_used(nNormals);

	// read normals
	for (u32 i = 0; i < nNormals; ++i)
		readVector3(normals[i]);

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Normals Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	core::array<u32> normalIndices;
	normalIndices.set_used(mesh.Indices.size());

	// read face normal indices
	const u32 nFNormals = readInt();
	// if (nFNormals >= mesh.IndexCountPerFace.size())
	if (0) { // this condition doesn't work for some reason
		os::Printer::log("Too many face normals found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	u32 normalidx = 0;
	core::array<u32> polygonfaces;
	for (u32 k = 0; k < nFNormals; ++k) {
		const u32 fcnt = readInt();
		u32 triangles = fcnt - 2;
		u32 indexcount = triangles * 3;

		if (indexcount != mesh.IndexCountPerFace[k]) {
			os::Printer::log("Not matching normal and face index count found in x file", ELL_WARNING);
			os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
			SET_ERR_AND_RETURN();
		}

		if (indexcount == 3) {
			// default, only one triangle in this face
			for (u32 h = 0; h < 3; ++h) {
				const u32 normalnum = readInt();
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[normalnum]);
			}
		} else {
			polygonfaces.set_used(fcnt);
			// multiple triangles in this face
			for (u32 h = 0; h < fcnt; ++h)
				polygonfaces[h] = readInt();

			for (u32 jk = 0; jk < triangles; ++jk) {
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[polygonfaces[0]]);
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[polygonfaces[jk + 1]]);
				mesh.Vertices[mesh.Indices[normalidx++]].Normal.set(normals[polygonfaces[jk + 2]]);
			}
		}
	}

	if (!checkForTwoFollowingSemicolons()) {
		os::Printer::log("No finishing semicolon in Mesh Face Normals Array found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
	}

	if (!checkForClosingBrace()) {
		os::Printer::log("No closing brace in Mesh Normals found in x file", ELL_WARNING);
		os::Printer::log("Line", core::stringc(Line).c_str(), ELL_WARNING);
		SET_ERR_AND_RETURN();
	}

	return true;
}